

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall
embree::TutorialApplication::keyboardFunc
          (TutorialApplication *this,GLFWwindow *window_in,int key,int scancode,int action,int mods)

{
  long lVar1;
  undefined3 uVar2;
  ImGuiIO *pIVar3;
  GLFWwindow *pGVar4;
  ostream *poVar5;
  void *pvVar6;
  long *plVar7;
  int in_EDX;
  string *in_RDI;
  int in_R8D;
  uint in_R9D;
  Camera *in_stack_00000098;
  Ref<embree::Image> image;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  TutorialApplication *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined8 in_stack_fffffffffffffe48;
  TutorialApplication *in_stack_fffffffffffffe50;
  allocator *in;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float local_178;
  float local_174;
  undefined8 in_stack_fffffffffffffe98;
  float dz;
  float in_stack_fffffffffffffea0;
  Camera *in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffebf;
  Col4<unsigned_char> *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 uVar8;
  undefined1 uVar9;
  allocator in_stack_fffffffffffffedf;
  Ref<embree::Image> *in_stack_fffffffffffffee0;
  long *local_100;
  undefined4 local_f4;
  undefined4 local_f0;
  float local_ec [7];
  string local_d0 [32];
  uint local_b0;
  int local_ac;
  int local_a4;
  long *local_90;
  long **local_88;
  long **local_80;
  undefined4 *local_70;
  undefined4 *local_68;
  float *local_60;
  float *local_58;
  undefined8 in_stack_ffffffffffffffb0;
  float dtheta;
  Camera *in_stack_ffffffffffffffb8;
  
  dz = (float)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_b0 = in_R9D;
  local_ac = in_R8D;
  local_a4 = in_EDX;
  ImGui_ImplGlfw_KeyCallback
            ((GLFWwindow *)in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20)
             ,(int)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
  pIVar3 = ImGui::GetIO();
  if ((pIVar3->WantCaptureKeyboard & 1U) == 0) {
    if (local_ac == 1) {
      (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,local_a4);
      if ((local_b0 & 2) == 0) {
        if (local_a4 == 0x20) {
          plVar7 = (long *)::operator_new(0x48);
          uVar9 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
          uVar8 = 1;
          in = (allocator *)&stack0xfffffffffffffedf;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffee0,"",in);
          ImageT<embree::Col4<unsigned_char>_>::ImageT
                    ((ImageT<embree::Col4<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffedf,CONCAT16(uVar8,in_stack_fffffffffffffed8)),
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     (bool)in_stack_fffffffffffffebf,in_RDI,(bool)uVar9);
          uVar9 = 0;
          local_88 = &local_100;
          local_90 = plVar7;
          if (plVar7 != (long *)0x0) {
            lVar1 = *local_100;
            local_100 = plVar7;
            (**(code **)(lVar1 + 0x10))();
            plVar7 = local_100;
          }
          local_100 = plVar7;
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
          embree::FileName::FileName
                    ((FileName *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (char *)in);
          storeImage(in_stack_fffffffffffffee0,
                     (FileName *)
                     CONCAT17(in_stack_fffffffffffffedf,CONCAT16(uVar9,in_stack_fffffffffffffed8)));
          embree::FileName::~FileName((FileName *)0x14d0d5);
          local_80 = &local_100;
          if (local_100 != (long *)0x0) {
            (**(code **)(*local_100 + 0x18))();
          }
        }
        else if (local_a4 == 0x41) {
          *(undefined4 *)((long)&in_RDI[0xd].field_2 + 4) = 0xbf800000;
        }
        else if (local_a4 == 0x43) {
          Camera::str_abi_cxx11_(in_stack_00000098);
          poVar5 = std::operator<<((ostream *)&std::cout,local_d0);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_d0);
        }
        else if (local_a4 == 0x44) {
          *(undefined4 *)((long)&in_RDI[0xd].field_2 + 4) = 0x3f800000;
        }
        else if (local_a4 == 0x46) {
          glfwDestroyWindow((GLFWwindow *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          if ((in_RDI[0xb].field_2._M_local_buf[9] & 1U) == 0) {
            *(undefined4 *)((long)&in_RDI[0xb].field_2 + 0xc) = *(undefined4 *)(in_RDI + 9);
            uVar2 = *(undefined3 *)&in_RDI[9].field_0x5;
            in_RDI[0xc]._M_dataplus = (_Alloc_hider)in_RDI[9].field_0x4;
            *(undefined3 *)&in_RDI[0xc].field_0x1 = uVar2;
            pGVar4 = createFullScreenWindow(in_stack_fffffffffffffe50);
            in_RDI[5]._M_string_length = (size_type)pGVar4;
            setCallbackFunctions
                      (in_stack_fffffffffffffe30,
                       (GLFWwindow *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          }
          else {
            *(undefined4 *)(in_RDI + 9) = *(undefined4 *)((long)&in_RDI[0xb].field_2 + 0xc);
            uVar2 = *(undefined3 *)&in_RDI[0xc].field_0x1;
            in_RDI[9].field_0x4 = in_RDI[0xc]._M_dataplus;
            *(undefined3 *)&in_RDI[9].field_0x5 = uVar2;
            pGVar4 = createStandardWindow
                               ((TutorialApplication *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                (int)in_stack_fffffffffffffe38);
            in_RDI[5]._M_string_length = (size_type)pGVar4;
            setCallbackFunctions
                      (in_stack_fffffffffffffe30,
                       (GLFWwindow *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          }
          glfwMakeContextCurrent((GLFWwindow *)in_stack_fffffffffffffe30);
          in_RDI[0xb].field_2._M_local_buf[9] = (in_RDI[0xb].field_2._M_local_buf[9] ^ 0xffU) & 1;
        }
        else {
          if (local_a4 != 0x51) {
            if (local_a4 == 0x53) {
              *(undefined4 *)((long)&in_RDI[0xd].field_2 + 0xc) = 0xbf800000;
              return;
            }
            if (local_a4 == 0x57) {
              *(undefined4 *)((long)&in_RDI[0xd].field_2 + 0xc) = 0x3f800000;
              return;
            }
            if (local_a4 != 0x100) {
              dtheta = (float)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
              if (local_a4 == 0x106) {
                Camera::rotate(in_stack_ffffffffffffffb8,dtheta,(float)in_stack_ffffffffffffffb0);
                return;
              }
              if (local_a4 == 0x107) {
                Camera::rotate(in_stack_ffffffffffffffb8,dtheta,(float)in_stack_ffffffffffffffb0);
                return;
              }
              if (local_a4 == 0x108) {
                Camera::move(in_stack_fffffffffffffea8,3.69943e-43,in_stack_fffffffffffffea0,dz);
                return;
              }
              if (local_a4 == 0x109) {
                Camera::move(in_stack_fffffffffffffea8,3.71344e-43,in_stack_fffffffffffffea0,dz);
                return;
              }
              if (local_a4 == 0x10a) {
                *(float *)&in_RDI[0xd].field_2 = *(float *)&in_RDI[0xd].field_2 * 1.2;
                return;
              }
              if (local_a4 == 0x10b) {
                *(float *)&in_RDI[0xd].field_2 = *(float *)&in_RDI[0xd].field_2 / 1.2;
                return;
              }
              if (local_a4 == 0x10c) {
                local_ec[3] = g_debug + 0.01;
                local_ec[2] = 0.0;
                local_ec[1] = 1.0;
                local_58 = local_ec + 1;
                local_174 = 1.0;
                if (local_ec[3] < 1.0) {
                  local_174 = local_ec[3];
                }
                local_178 = 0.0;
                if (0.0 <= local_174) {
                  local_178 = local_174;
                }
                g_debug = local_178;
                poVar5 = std::operator<<((ostream *)&std::cout,"g_debug");
                poVar5 = std::operator<<(poVar5," = ");
                pvVar6 = (void *)std::ostream::operator<<(poVar5,g_debug);
                std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
                return;
              }
              if (local_a4 != 0x10d) {
                return;
              }
              local_ec[0] = g_debug - 0.01;
              local_f0 = 0;
              local_f4 = 0x3f800000;
              local_60 = local_ec;
              local_68 = &local_f0;
              local_70 = &local_f4;
              g_debug = 1.0;
              if (local_ec[0] < 1.0) {
                g_debug = local_ec[0];
              }
              if (g_debug < 0.0) {
                g_debug = 0.0;
              }
              poVar5 = std::operator<<((ostream *)&std::cout,"g_debug");
              poVar5 = std::operator<<(poVar5," = ");
              pvVar6 = (void *)std::ostream::operator<<(poVar5,g_debug);
              std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
              return;
            }
          }
          glfwSetWindowShouldClose
                    ((GLFWwindow *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
        }
      }
      else {
        switch(local_a4) {
        case 0x106:
          *(int *)((long)&in_RDI[0xc].field_2 + 4) = *(int *)((long)&in_RDI[0xc].field_2 + 4) + 1;
          set_parameter(in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0x14c820);
          poVar5 = std::operator<<((ostream *)&std::cout,"debug_int1");
          poVar5 = std::operator<<(poVar5," = ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,*(int *)((long)&in_RDI[0xc].field_2 + 4))
          ;
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          break;
        case 0x107:
          *(int *)((long)&in_RDI[0xc].field_2 + 4) = *(int *)((long)&in_RDI[0xc].field_2 + 4) + -1;
          set_parameter(in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0x14c7af);
          poVar5 = std::operator<<((ostream *)&std::cout,"debug_int1");
          poVar5 = std::operator<<(poVar5," = ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,*(int *)((long)&in_RDI[0xc].field_2 + 4))
          ;
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          break;
        case 0x108:
          *(int *)&in_RDI[0xc].field_2 = *(int *)&in_RDI[0xc].field_2 + -1;
          set_parameter(in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0x14c73b);
          poVar5 = std::operator<<((ostream *)&std::cout,"debug_int0");
          poVar5 = std::operator<<(poVar5," = ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,*(int *)&in_RDI[0xc].field_2);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          break;
        case 0x109:
          *(int *)&in_RDI[0xc].field_2 = *(int *)&in_RDI[0xc].field_2 + 1;
          set_parameter(in_stack_fffffffffffffe30,
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),0x14c6c7);
          poVar5 = std::operator<<((ostream *)&std::cout,"debug_int0");
          poVar5 = std::operator<<(poVar5," = ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,*(int *)&in_RDI[0xc].field_2);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    else if (local_ac == 0) {
      switch(local_a4) {
      case 0x41:
        *(undefined4 *)((long)&in_RDI[0xd].field_2 + 4) = 0;
        break;
      case 0x44:
        *(undefined4 *)((long)&in_RDI[0xd].field_2 + 4) = 0;
        break;
      case 0x53:
        *(undefined4 *)((long)&in_RDI[0xd].field_2 + 0xc) = 0;
        break;
      case 0x57:
        *(undefined4 *)((long)&in_RDI[0xd].field_2 + 0xc) = 0;
      }
    }
  }
  return;
}

Assistant:

void TutorialApplication::keyboardFunc(GLFWwindow* window_in, int key, int scancode, int action, int mods)
  {
    ImGui_ImplGlfw_KeyCallback(window_in,key,scancode,action,mods);
    if (ImGui::GetIO().WantCaptureKeyboard) return;
      
    if (action == GLFW_PRESS)
    {
      /* call tutorial keyboard handler */
      keypressed(key);

      if (mods & GLFW_MOD_CONTROL)
      {
        switch (key) {
        case GLFW_KEY_UP        : debug_int0++; set_parameter(1000000,debug_int0); PRINT(debug_int0); break;
        case GLFW_KEY_DOWN      : debug_int0--; set_parameter(1000000,debug_int0); PRINT(debug_int0); break;
        case GLFW_KEY_LEFT      : debug_int1--; set_parameter(1000001,debug_int1); PRINT(debug_int1); break;
        case GLFW_KEY_RIGHT     : debug_int1++; set_parameter(1000001,debug_int1); PRINT(debug_int1); break;
        }
      }
      else
      {
        switch (key) {
        case GLFW_KEY_LEFT      : camera.rotate(-0.02f,0.0f); break;
        case GLFW_KEY_RIGHT     : camera.rotate(+0.02f,0.0f); break;
        case GLFW_KEY_UP        : camera.move(0.0f,0.0f,+speed); break;
        case GLFW_KEY_DOWN      : camera.move(0.0f,0.0f,-speed); break;
        case GLFW_KEY_PAGE_UP   : speed *= 1.2f; break;
        case GLFW_KEY_PAGE_DOWN : speed /= 1.2f; break;

        case GLFW_KEY_W : moveDelta.z = +1.0f; break;
        case GLFW_KEY_S : moveDelta.z = -1.0f; break;
        case GLFW_KEY_A : moveDelta.x = -1.0f; break;
        case GLFW_KEY_D : moveDelta.x = +1.0f; break;
          
        case GLFW_KEY_F :
          glfwDestroyWindow(window);
          if (fullscreen) {
            width = window_width;
            height = window_height;
            window = createStandardWindow(width,height);
            setCallbackFunctions(window);
          }
          else {
            window_width = width;
            window_height = height;
            window = createFullScreenWindow();
            setCallbackFunctions(window);
          }
          glfwMakeContextCurrent(window);
          fullscreen = !fullscreen;
          break;
          
        case GLFW_KEY_C : std::cout << camera.str() << std::endl; break;
        case GLFW_KEY_HOME: g_debug=clamp(g_debug+0.01f); PRINT(g_debug); break;
        case GLFW_KEY_END : g_debug=clamp(g_debug-0.01f); PRINT(g_debug); break;
          
        case GLFW_KEY_SPACE: {
          Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels, true, "", true);
          storeImage(image, "screenshot.tga");
          break;
        }
          
        case GLFW_KEY_ESCAPE:
        case GLFW_KEY_Q: 
          glfwSetWindowShouldClose(window,1);
          break;
        }
      }
    }
    else if (action == GLFW_RELEASE)
    {
      switch (key)
      {
      case GLFW_KEY_W : moveDelta.z = 0.0f; break;
      case GLFW_KEY_S : moveDelta.z = 0.0f; break;
      case GLFW_KEY_A : moveDelta.x = 0.0f; break;
      case GLFW_KEY_D : moveDelta.x = 0.0f; break;
      }
    }
  }